

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSession::InternalCreate(RTPSession *this,RTPSessionParams *sessparams)

{
  RTPSessionSources *this_00;
  RTPPacketBuilder *this_01;
  RTCPPacketBuilder *this_02;
  double dVar1;
  double dVar2;
  pointer pcVar3;
  RTPMemoryManager *pRVar4;
  RTPTransmitter *pRVar5;
  int iVar6;
  undefined4 extraout_var;
  uint32_t ssrc;
  size_t buflen;
  RTCPSchedulerParams schedparams;
  string forcedcname;
  uint8_t buf [1024];
  size_t local_490;
  RTCPSchedulerParams local_488;
  long *local_468;
  long local_460;
  long local_458 [2];
  double local_448;
  RTPTime local_440;
  uint8_t local_438 [1023];
  undefined1 local_39;
  
  this_01 = &this->packetbuilder;
  iVar6 = RTPPacketBuilder::Init(this_01,this->maxpacksize);
  if (iVar6 < 0) {
LAB_0011a9d8:
    if (this->deletetransmitter == true) {
      pRVar4 = (this->super_RTPMemoryObject).mgr;
      pRVar5 = this->rtptrans;
      if (pRVar4 == (RTPMemoryManager *)0x0) {
        if (pRVar5 != (RTPTransmitter *)0x0) {
          (*(pRVar5->super_RTPMemoryObject)._vptr_RTPMemoryObject[1])(pRVar5);
        }
      }
      else {
        (**(pRVar5->super_RTPMemoryObject)._vptr_RTPMemoryObject)(pRVar5);
        (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pRVar5);
      }
    }
    return iVar6;
  }
  if (sessparams->usepredefinedssrc == true) {
    (this->packetbuilder).ssrc = sessparams->predefinedssrc;
  }
  this_00 = &this->sources;
  (this->sources).super_RTPSources.probationtype = sessparams->probationtype;
  ssrc = 0;
  if ((this->packetbuilder).init != false) {
    ssrc = (this->packetbuilder).ssrc;
  }
  iVar6 = RTPSources::CreateOwnSSRC(&this_00->super_RTPSources,ssrc);
  if (iVar6 < 0) {
    RTPPacketBuilder::Destroy(this_01);
    goto LAB_0011a9d8;
  }
  iVar6 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x17])
                    (this->rtptrans,(ulong)sessparams->receivemode);
  if (iVar6 < 0) {
    RTPPacketBuilder::Destroy(this_01);
    RTPSources::Clear(&this_00->super_RTPSources);
    goto LAB_0011a9d8;
  }
  local_448 = sessparams->owntsunit;
  local_490 = 0x400;
  local_468 = local_458;
  pcVar3 = (sessparams->cname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_468,pcVar3,pcVar3 + (sessparams->cname)._M_string_length);
  if (local_460 == 0) {
    iVar6 = CreateCNAME(this,local_438,&local_490,sessparams->resolvehostname);
    if (iVar6 < 0) {
      RTPPacketBuilder::Destroy(this_01);
      RTPSources::Clear(&this_00->super_RTPSources);
      if (this->deletetransmitter == true) {
        RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
      }
      goto LAB_0011aced;
    }
  }
  else {
    strncpy((char *)local_438,(char *)local_468,0x400);
    local_39 = 0;
    local_490 = strlen((char *)local_438);
  }
  this_02 = &this->rtcpbuilder;
  iVar6 = RTCPPacketBuilder::Init(this_02,this->maxpacksize,local_448,local_438,local_490);
  if (iVar6 < 0) {
    RTPPacketBuilder::Destroy(this_01);
    RTPSources::Clear(&this_00->super_RTPSources);
    if (this->deletetransmitter == true) {
      pRVar4 = (this->super_RTPMemoryObject).mgr;
      pRVar5 = this->rtptrans;
      if (pRVar4 == (RTPMemoryManager *)0x0) {
        if (pRVar5 != (RTPTransmitter *)0x0) {
          (*(pRVar5->super_RTPMemoryObject)._vptr_RTPMemoryObject[1])(pRVar5);
        }
      }
      else {
        (**(pRVar5->super_RTPMemoryObject)._vptr_RTPMemoryObject)(pRVar5);
        (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pRVar5);
      }
    }
  }
  else {
    RTCPScheduler::Reset(&this->rtcpsched);
    iVar6 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])();
    (this->rtcpsched).headeroverhead = CONCAT44(extraout_var,iVar6);
    RTCPSchedulerParams::RTCPSchedulerParams(&local_488);
    dVar1 = sessparams->sessionbandwidth;
    this->sessionbandwidth = dVar1;
    dVar2 = sessparams->controlfrac;
    this->controlfragment = dVar2;
    iVar6 = RTCPSchedulerParams::SetRTCPBandwidth(&local_488,dVar1 * dVar2);
    if (iVar6 < 0) {
      if (this->deletetransmitter == true) {
        pRVar4 = (this->super_RTPMemoryObject).mgr;
        pRVar5 = this->rtptrans;
        if (pRVar4 == (RTPMemoryManager *)0x0) {
          if (pRVar5 != (RTPTransmitter *)0x0) {
            (*(pRVar5->super_RTPMemoryObject)._vptr_RTPMemoryObject[1])(pRVar5);
          }
        }
        else {
          (**(pRVar5->super_RTPMemoryObject)._vptr_RTPMemoryObject)(pRVar5);
          (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pRVar5);
        }
      }
      RTPPacketBuilder::Destroy(this_01);
      RTPSources::Clear(&this_00->super_RTPSources);
      RTCPPacketBuilder::Destroy(this_02);
    }
    else {
      iVar6 = RTCPSchedulerParams::SetSenderBandwidthFraction(&local_488,sessparams->senderfrac);
      if (iVar6 < 0) {
        if (this->deletetransmitter == true) {
          RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
        }
        RTPPacketBuilder::Destroy(this_01);
        RTPSources::Clear(&this_00->super_RTPSources);
        RTCPPacketBuilder::Destroy(this_02);
      }
      else {
        local_440.m_t = (sessparams->mininterval).m_t;
        iVar6 = RTCPSchedulerParams::SetMinimumTransmissionInterval(&local_488,&local_440);
        if (iVar6 < 0) {
          if (this->deletetransmitter == true) {
            RTPDelete<jrtplib::RTPTransmitter>(this->rtptrans,(this->super_RTPMemoryObject).mgr);
          }
          RTPPacketBuilder::Destroy(this_01);
          RTPSources::Clear(&this_00->super_RTPSources);
          RTCPPacketBuilder::Destroy(this_02);
        }
        else {
          local_488.usehalfatstartup = sessparams->usehalfatstartup;
          local_488.immediatebye = sessparams->immediatebye;
          (this->rtcpsched).schedparams.bandwidth = local_488.bandwidth;
          (this->rtcpsched).schedparams.senderfraction =
               (double)CONCAT62(local_488.senderfraction._2_6_,local_488.senderfraction._0_2_);
          *(ulong *)((long)&(this->rtcpsched).schedparams.senderfraction + 2) =
               CONCAT26(local_488.mininterval.m_t._0_2_,local_488.senderfraction._2_6_);
          *(undefined4 *)((long)&(this->rtcpsched).schedparams.mininterval.m_t + 2) =
               local_488.mininterval.m_t._2_4_;
          *(undefined2 *)((long)&(this->rtcpsched).schedparams.mininterval.m_t + 6) =
               local_488.mininterval.m_t._6_2_;
          (this->rtcpsched).schedparams.usehalfatstartup = local_488.usehalfatstartup;
          (this->rtcpsched).schedparams.immediatebye = local_488.immediatebye;
          this->acceptownpackets = sessparams->acceptown;
          this->membermultiplier = sessparams->generaltimeoutmultiplier;
          this->sendermultiplier = sessparams->sendermultiplier;
          this->byemultiplier = sessparams->byetimeoutmultiplier;
          this->collisionmultiplier = sessparams->collisionmultiplier;
          this->notemultiplier = sessparams->notemultiplier;
          this->created = true;
          iVar6 = 0;
        }
      }
    }
    RTCPSchedulerParams::~RTCPSchedulerParams(&local_488);
  }
LAB_0011aced:
  if (local_468 == local_458) {
    return iVar6;
  }
  operator_delete(local_468,local_458[0] + 1);
  return iVar6;
}

Assistant:

int RTPSession::InternalCreate(const RTPSessionParams &sessparams)
{
	int status;

	// Initialize packet builder
	
	if ((status = packetbuilder.Init(maxpacksize)) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	if (sessparams.GetUsePredefinedSSRC())
		packetbuilder.AdjustSSRC(sessparams.GetPredefinedSSRC());

#ifdef RTP_SUPPORT_PROBATION

	// Set probation type
	sources.SetProbationType(sessparams.GetProbationType());

#endif // RTP_SUPPORT_PROBATION

	// Add our own ssrc to the source table
	
	if ((status = sources.CreateOwnSSRC(packetbuilder.GetSSRC())) < 0)
	{
		packetbuilder.Destroy();
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	// Set the initial receive mode
	
	if ((status = rtptrans->SetReceiveMode(sessparams.GetReceiveMode())) < 0)
	{
		packetbuilder.Destroy();
		sources.Clear();
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	// Init the RTCP packet builder
	
	double timestampunit = sessparams.GetOwnTimestampUnit();
	uint8_t buf[1024];
	size_t buflen = 1024;
	std::string forcedcname = sessparams.GetCNAME(); 

	if (forcedcname.length() == 0)
	{
		if ((status = CreateCNAME(buf,&buflen,sessparams.GetResolveLocalHostname())) < 0)
		{
			packetbuilder.Destroy();
			sources.Clear();
			if (deletetransmitter)
				RTPDelete(rtptrans,GetMemoryManager());
			return status;
		}
	}
	else
	{
		RTP_STRNCPY((char *)buf, forcedcname.c_str(), buflen);
		buf[buflen-1] = 0;
		buflen = strlen((char *)buf);
	}
	
	if ((status = rtcpbuilder.Init(maxpacksize,timestampunit,buf,buflen)) < 0)
	{
		packetbuilder.Destroy();
		sources.Clear();
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		return status;
	}

	// Set scheduler parameters
	
	rtcpsched.Reset();
	rtcpsched.SetHeaderOverhead(rtptrans->GetHeaderOverhead());

	RTCPSchedulerParams schedparams;

	sessionbandwidth = sessparams.GetSessionBandwidth();
	controlfragment = sessparams.GetControlTrafficFraction();
	
	if ((status = schedparams.SetRTCPBandwidth(sessionbandwidth*controlfragment)) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		packetbuilder.Destroy();
		sources.Clear();
		rtcpbuilder.Destroy();
		return status;
	}
	if ((status = schedparams.SetSenderBandwidthFraction(sessparams.GetSenderControlBandwidthFraction())) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		packetbuilder.Destroy();
		sources.Clear();
		rtcpbuilder.Destroy();
		return status;
	}
	if ((status = schedparams.SetMinimumTransmissionInterval(sessparams.GetMinimumRTCPTransmissionInterval())) < 0)
	{
		if (deletetransmitter)
			RTPDelete(rtptrans,GetMemoryManager());
		packetbuilder.Destroy();
		sources.Clear();
		rtcpbuilder.Destroy();
		return status;
	}
	schedparams.SetUseHalfAtStartup(sessparams.GetUseHalfRTCPIntervalAtStartup());
	schedparams.SetRequestImmediateBYE(sessparams.GetRequestImmediateBYE());
	
	rtcpsched.SetParameters(schedparams);

	// copy other parameters
	
	acceptownpackets = sessparams.AcceptOwnPackets();
	membermultiplier = sessparams.GetSourceTimeoutMultiplier();
	sendermultiplier = sessparams.GetSenderTimeoutMultiplier();
	byemultiplier = sessparams.GetBYETimeoutMultiplier();
	collisionmultiplier = sessparams.GetCollisionTimeoutMultiplier();
	notemultiplier = sessparams.GetNoteTimeoutMultiplier();

	// Do thread stuff if necessary
	
#ifdef RTP_SUPPORT_THREAD
	pollthread = 0;
	if (usingpollthread)
	{
		if (!sourcesmutex.IsInitialized())	
		{
			if (sourcesmutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		if (!buildermutex.IsInitialized())
		{
			if (buildermutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		if (!schedmutex.IsInitialized())
		{
			if (schedmutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		if (!packsentmutex.IsInitialized())
		{
			if (packsentmutex.Init() < 0)
			{
				if (deletetransmitter)
					RTPDelete(rtptrans,GetMemoryManager());
				packetbuilder.Destroy();
				sources.Clear();
				rtcpbuilder.Destroy();
				return ERR_RTP_SESSION_CANTINITMUTEX;
			}
		}
		
		pollthread = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPPOLLTHREAD) RTPPollThread(*this,rtcpsched);
		if (pollthread == 0)
		{
			if (deletetransmitter)
				RTPDelete(rtptrans,GetMemoryManager());
			packetbuilder.Destroy();
			sources.Clear();
			rtcpbuilder.Destroy();
			return ERR_RTP_OUTOFMEM;
		}
		if ((status = pollthread->Start(rtptrans)) < 0)
		{
			if (deletetransmitter)
				RTPDelete(rtptrans,GetMemoryManager());
			RTPDelete(pollthread,GetMemoryManager());
			packetbuilder.Destroy();
			sources.Clear();
			rtcpbuilder.Destroy();
			return status;
		}
	}
#endif // RTP_SUPPORT_THREAD	

	created = true;
	return 0;
}